

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O2

UBool __thiscall icu_63::ResourceArray::getValue(ResourceArray *this,int32_t i,ResourceValue *value)

{
  int iVar1;
  bool bVar2;
  uint32_t uVar3;
  ResourceDataValue *rdValue;
  
  bVar2 = false;
  if (-1 < i) {
    iVar1 = this->length;
    if (i < iVar1) {
      uVar3 = internalGetResource(this,(ResourceData *)value[1].super_UObject._vptr_UObject,i);
      *(uint32_t *)&value[2].super_UObject._vptr_UObject = uVar3;
    }
    bVar2 = i < iVar1;
  }
  return bVar2;
}

Assistant:

UBool icu::ResourceArray::getValue(int32_t i, icu::ResourceValue &value) const {
    if(0 <= i && i < length) {
        icu::ResourceDataValue &rdValue = static_cast<icu::ResourceDataValue &>(value);
        rdValue.setResource(internalGetResource(rdValue.pResData, i));
        return TRUE;
    }
    return FALSE;
}